

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_dc
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  WORD32 log2nt;
  WORD32 col;
  WORD32 row;
  WORD32 i;
  WORD32 dc_val_v;
  WORD32 dc_val_u;
  WORD32 acc_dc_v;
  WORD32 acc_dc_u;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  log2nt._0_1_ = '\x05';
  switch(nt) {
  case 4:
    log2nt._0_1_ = '\x02';
    break;
  default:
    break;
  case 8:
    log2nt._0_1_ = '\x03';
    break;
  case 0x10:
    log2nt._0_1_ = '\x04';
    break;
  case 0x20:
    log2nt._0_1_ = '\x05';
  }
  acc_dc_u = 0;
  acc_dc_v = 0;
  for (i = nt << 1; i < nt * 4; i = i + 2) {
    acc_dc_u = (uint)pu1_ref[i] + acc_dc_u;
    acc_dc_v = (uint)pu1_ref[i + 1] + acc_dc_v;
  }
  iVar1 = nt * 4;
  while (i = iVar1 + 2, i < nt * 6 + 2) {
    acc_dc_u = (uint)pu1_ref[i] + acc_dc_u;
    acc_dc_v = (uint)pu1_ref[iVar1 + 3] + acc_dc_v;
    iVar1 = i;
  }
  for (row = 0; row < nt; row = row + 1) {
    for (col = 0; SBORROW4(col,nt * 2) != col + nt * -2 < 0; col = col + 2) {
      pu1_dst[row * dst_strd + col] = (UWORD8)(acc_dc_u + nt >> (char)log2nt + 1);
      pu1_dst[row * dst_strd + col + 1] = (UWORD8)(acc_dc_v + nt >> (char)log2nt + 1);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_dc(UWORD8 *pu1_ref,
                                WORD32 src_strd,
                                UWORD8 *pu1_dst,
                                WORD32 dst_strd,
                                WORD32 nt,
                                WORD32 mode)
{

    WORD32 acc_dc_u, acc_dc_v;
    WORD32 dc_val_u, dc_val_v;
    WORD32 i;
    WORD32 row, col;
    WORD32 log2nt = 5;
    UNUSED(mode);
    UNUSED(src_strd);
    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }


    acc_dc_u = 0;
    acc_dc_v = 0;
    /* Calculate DC value for the transform block */
    for(i = (2 * nt); i < (4 * nt); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }
    for(i = ((4 * nt) + 2); i < ((6 * nt) + 2); i += 2)
    {
        acc_dc_u += pu1_ref[i];
        acc_dc_v += pu1_ref[i + 1];
    }


    dc_val_u = (acc_dc_u + nt) >> (log2nt + 1);
    dc_val_v = (acc_dc_v + nt) >> (log2nt + 1);


    /* Fill the remaining rows with DC value*/
    for(row = 0; row < nt; row++)
    {
        for(col = 0; col < (2 * nt); col += 2)
        {
            pu1_dst[(row * dst_strd) + col] = dc_val_u;
            pu1_dst[(row * dst_strd) + col + 1] = dc_val_v;
        }
    }

}